

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int m_encode_se(aec_stream *strm)

{
  uint32_t uVar1;
  uint32_t uVar2;
  internal_state *state;
  int iVar3;
  ulong uVar4;
  
  state = strm->state;
  emit(state,1,state->id_len + 1);
  if (state->ref != 0) {
    emit(state,state->ref_sample,strm->bits_per_sample);
  }
  for (uVar4 = 0; uVar4 < strm->block_size; uVar4 = uVar4 + 2) {
    uVar1 = state->block[uVar4];
    uVar2 = state->block[uVar4 + 1];
    emitfs(state,((uVar2 + uVar1 + 1) * (uVar2 + uVar1) >> 1) + uVar2);
  }
  iVar3 = m_flush_block(strm);
  return iVar3;
}

Assistant:

static int m_encode_se(struct aec_stream *strm)
{
    size_t i;
    uint32_t d;
    struct internal_state *state = strm->state;

    emit(state, 1, state->id_len + 1);
    if (state->ref)
        emit(state, state->ref_sample, strm->bits_per_sample);

    for (i = 0; i < strm->block_size; i+= 2) {
        d = state->block[i] + state->block[i + 1];
        emitfs(state, d * (d + 1) / 2 + state->block[i + 1]);
    }

    return m_flush_block(strm);
}